

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O1

QVariantHash contactInfo(QString *name,QString *email)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QVariant *pQVar5;
  QString *in_RDX;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  Private __tmp;
  QVariant moved;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 uStack_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  undefined8 uStack_60;
  QString local_58;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 uStack_20;
  
  (name->d).d = (Data *)0x0;
  QVariant::QVariant((QVariant *)&local_98,(QString *)email);
  QVar6.m_data = (storage_type *)0x4;
  QVar6.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar6);
  local_58.d.d = (Data *)local_78;
  local_58.d.ptr = pcStack_70;
  local_58.d.size = local_68;
  pQVar5 = QHash<QString,_QVariant>::operator[]((QHash<QString,_QVariant> *)name,&local_58);
  uVar4 = uStack_80;
  uVar3 = local_98._16_8_;
  uVar2 = local_98._8_8_;
  uVar1 = local_98.shared;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  uStack_80 = 2;
  local_78 = (QArrayData *)(pQVar5->d).data.shared;
  pcStack_70 = *(char16_t **)((long)&(pQVar5->d).data + 8);
  local_68 = *(qsizetype *)((long)&(pQVar5->d).data + 0x10);
  uStack_60 = *(undefined8 *)&(pQVar5->d).field_0x18;
  *(undefined8 *)((long)&(pQVar5->d).data + 0x10) = uVar3;
  *(undefined8 *)&(pQVar5->d).field_0x18 = uVar4;
  (pQVar5->d).data.shared = (PrivateShared *)uVar1;
  *(undefined8 *)((long)&(pQVar5->d).data + 8) = uVar2;
  local_38.shared = (PrivateShared *)local_78;
  local_38._8_8_ = pcStack_70;
  local_38._16_8_ = local_68;
  uStack_20 = uStack_60;
  QVariant::~QVariant((QVariant *)&local_38);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_98);
  QVariant::QVariant((QVariant *)&local_98,in_RDX);
  QVar7.m_data = (storage_type *)0x5;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar7);
  local_58.d.d = (Data *)local_78;
  local_58.d.ptr = pcStack_70;
  local_58.d.size = local_68;
  pQVar5 = QHash<QString,_QVariant>::operator[]((QHash<QString,_QVariant> *)name,&local_58);
  uVar4 = uStack_80;
  uVar3 = local_98._16_8_;
  uVar2 = local_98._8_8_;
  uVar1 = local_98.shared;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  uStack_80 = 2;
  local_78 = (QArrayData *)(pQVar5->d).data.shared;
  pcStack_70 = *(char16_t **)((long)&(pQVar5->d).data + 8);
  local_68 = *(undefined8 *)((long)&(pQVar5->d).data + 0x10);
  uStack_60 = *(undefined8 *)&(pQVar5->d).field_0x18;
  *(undefined8 *)((long)&(pQVar5->d).data + 0x10) = uVar3;
  *(undefined8 *)&(pQVar5->d).field_0x18 = uVar4;
  (pQVar5->d).data.shared = (PrivateShared *)uVar1;
  *(undefined8 *)((long)&(pQVar5->d).data + 8) = uVar2;
  local_38.shared = (PrivateShared *)local_78;
  local_38._8_8_ = pcStack_70;
  local_38._16_8_ = local_68;
  uStack_20 = uStack_60;
  QVariant::~QVariant((QVariant *)&local_38);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QVariant::~QVariant((QVariant *)&local_98);
  return (QVariantHash)(Data *)name;
}

Assistant:

QVariantHash contactInfo(const QString& name, const QString& email)
{
	QVariantHash map;
	map["name"] = name;
	map["email"] = email;
	return map;
}